

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O0

ProgramContext * __thiscall
deqp::gles3::Performance::anon_unknown_1::FunctionCase::generateSingleProgramData
          (ProgramContext *__return_storage_ptr__,FunctionCase *this,ProgramID programID)

{
  DataType dataType;
  undefined4 x;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  ostream *poVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  string *local_ea8;
  char *local_ea0;
  char *local_e48;
  char *local_e38;
  int local_e08;
  char *local_bc0;
  ostream *local_b28;
  string *local_af0;
  string local_ab8;
  string local_a98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  allocator<char> local_a31;
  undefined1 local_a30 [8];
  string description;
  Vector<float,_4> local_a00;
  Vector<float,_4> local_9f0;
  Vector<float,_4> local_9e0;
  string local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  AttribSpec local_990;
  int local_92c;
  undefined1 local_928 [4];
  int i_9;
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  attributes;
  int i_8;
  int i_7;
  int i_6;
  int size;
  int inputNdx_4;
  string finalResType;
  int inputNdx_3;
  int numFinalResComponents;
  int inputNdx_2;
  DataType finalResultDataType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  string local_888;
  int local_868;
  allocator<char> local_861;
  int i_5;
  string expr_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  string local_7a0;
  int local_77c;
  undefined1 local_778 [4];
  int i_4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  undefined1 local_738 [8];
  string expr;
  undefined1 local_710 [4];
  int inputNdx_1;
  undefined1 local_6f0 [8];
  string incExpr_1;
  undefined1 local_6b0 [8];
  string evalName;
  undefined1 local_670 [8];
  string resName;
  undefined1 local_648 [4];
  int paramNdx_2;
  undefined1 local_628 [8];
  string incExpr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  undefined1 local_5c8 [8];
  string incName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_588;
  undefined1 local_568 [8];
  string inputName;
  int inputNdx;
  int calcNdx_1;
  int i_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  undefined1 local_4f8 [8];
  string swizzle;
  int numCols;
  int numRows;
  int iStack_4c8;
  bool mustCast;
  DataType paramType;
  int paramNdx_1;
  int calcNdx;
  char *inPrefix;
  int local_4b0;
  int paramNdx;
  int i_2;
  int i_1;
  ostringstream *op;
  ostringstream frag;
  ostringstream vtx;
  int numAttributes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  byte local_162;
  allocator<char> local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  int local_13c;
  string local_138 [4];
  int i;
  string paramPrecisionsMaybe [3];
  char *paramTypeNames [3];
  int numParams;
  bool isMatrixReturn;
  char *inputPrecision;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  byte local_52;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string returnPrecisionMaybe;
  char *returnTypeName;
  char *precision;
  bool isVertexCase;
  ProgramID programID_local;
  FunctionCase *this_local;
  
  bVar11 = (this->super_OperatorPerformanceCase).m_caseType == CASETYPE_VERTEX;
  pcVar6 = glu::getPrecisionName(this->m_precision);
  returnPrecisionMaybe.field_2._8_8_ = glu::getDataTypeName(this->m_returnType);
  bVar1 = glu::isDataTypeBoolOrBVec(this->m_returnType);
  local_52 = 0;
  if (bVar1) {
    std::allocator<char>::allocator();
    local_52 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,"",&local_51);
  }
  else {
    std::__cxx11::string::string((string *)&local_a8);
    std::operator+(&local_88,&local_a8,pcVar6);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                   &local_88," ");
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  if ((local_52 & 1) != 0) {
    std::allocator<char>::~allocator(&local_51);
  }
  _numParams = (char *)0x0;
  bVar1 = glu::isDataTypeMatrix(this->m_returnType);
  paramTypeNames[2]._0_4_ = 0;
  local_af0 = local_138;
  do {
    std::__cxx11::string::string(local_af0);
    local_af0 = local_af0 + 0x20;
  } while (local_af0 != (string *)((long)&paramPrecisionsMaybe[2].field_2 + 8));
  for (local_13c = 0; local_13c < 3; local_13c = local_13c + 1) {
    pcVar7 = glu::getDataTypeName(this->m_paramTypes[local_13c]);
    paramTypeNames[(long)local_13c + -1] = pcVar7;
    local_162 = 0;
    bVar2 = glu::isDataTypeBoolOrBVec(this->m_paramTypes[local_13c]);
    if (bVar2) {
      std::allocator<char>::allocator();
      local_162 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"",&local_161);
    }
    else {
      std::__cxx11::string::string((string *)&numAttributes);
      std::operator+(&local_188,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &numAttributes,pcVar6);
      std::operator+(&local_160,&local_188," ");
    }
    vtx._374_1_ = !bVar2;
    std::__cxx11::string::operator=(local_138 + (long)local_13c * 0x20,(string *)&local_160);
    std::__cxx11::string::~string((string *)&local_160);
    if ((bool)vtx._374_1_) {
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&numAttributes);
    }
    if ((local_162 & 1) != 0) {
      std::allocator<char>::~allocator(&local_161);
    }
    if (((_numParams == (char *)0x0) &&
        (bVar2 = glu::isDataTypeIntOrIVec(this->m_paramTypes[local_13c]), bVar2)) &&
       (this->m_precision == PRECISION_LOWP)) {
      _numParams = "mediump";
    }
    if (this->m_paramTypes[local_13c] != TYPE_INVALID) {
      paramTypeNames[2]._0_4_ = local_13c + 1;
    }
  }
  if (_numParams == (char *)0x0) {
    _numParams = pcVar6;
  }
  iVar3 = (int)paramTypeNames[2] + 3;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag.field_0x170);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&op);
  if (bVar11) {
    local_b28 = (ostream *)&frag.field_0x170;
  }
  else {
    local_b28 = (ostream *)&op;
  }
  std::operator<<((ostream *)&frag.field_0x170,"#version 300 es\n");
  poVar8 = std::operator<<((ostream *)&op,"#version 300 es\n");
  std::operator<<(poVar8,"layout (location = 0) out mediump vec4 o_color;\n");
  std::operator<<((ostream *)&frag.field_0x170,"in highp vec4 a_position;\n");
  for (paramNdx = 0; paramNdx < iVar3; paramNdx = paramNdx + 1) {
    poVar8 = std::operator<<((ostream *)&frag.field_0x170,"in ");
    poVar8 = std::operator<<(poVar8,_numParams);
    poVar8 = std::operator<<(poVar8," vec4 a_in");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,paramNdx);
    std::operator<<(poVar8,";\n");
  }
  if (bVar11) {
    std::operator<<((ostream *)&frag.field_0x170,"out mediump vec4 v_color;\n");
    std::operator<<((ostream *)&op,"in mediump vec4 v_color;\n");
  }
  else {
    for (local_4b0 = 0; local_4b0 < iVar3; local_4b0 = local_4b0 + 1) {
      poVar8 = std::operator<<((ostream *)&frag.field_0x170,"out ");
      poVar8 = std::operator<<(poVar8,_numParams);
      poVar8 = std::operator<<(poVar8," vec4 v_in");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_4b0);
      std::operator<<(poVar8,";\n");
      poVar8 = std::operator<<((ostream *)&op,"in ");
      poVar8 = std::operator<<(poVar8,_numParams);
      poVar8 = std::operator<<(poVar8," vec4 v_in");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_4b0);
      std::operator<<(poVar8,";\n");
    }
  }
  std::operator<<(local_b28,"uniform mediump int u_numLoopIterations;\n");
  if (bVar11) {
    std::operator<<(local_b28,"uniform mediump float u_zero;\n");
  }
  for (inPrefix._4_4_ = 0; inPrefix._4_4_ < (int)paramTypeNames[2];
      inPrefix._4_4_ = inPrefix._4_4_ + 1) {
    poVar8 = std::operator<<(local_b28,"uniform ");
    poVar8 = std::operator<<(poVar8,local_138 + (long)inPrefix._4_4_ * 0x20);
    poVar8 = std::operator<<(poVar8,paramTypeNames[(long)inPrefix._4_4_ + -1]);
    poVar8 = std::operator<<(poVar8," u_inc");
    poVar8 = std::operator<<(poVar8,(char)inPrefix._4_4_ + 'A');
    std::operator<<(poVar8,";\n");
  }
  std::operator<<((ostream *)&frag.field_0x170,"\n");
  std::operator<<((ostream *)&frag.field_0x170,"void main()\n");
  std::operator<<((ostream *)&frag.field_0x170,"{\n");
  if (!bVar11) {
    std::operator<<((ostream *)&frag.field_0x170,"\tgl_Position = a_position;\n");
  }
  std::operator<<((ostream *)&op,"\n");
  std::operator<<((ostream *)&op,"void main()\n");
  std::operator<<((ostream *)&op,"{\n");
  if (bVar11) {
    local_bc0 = "a_";
  }
  else {
    local_bc0 = "v_";
  }
  for (paramType = TYPE_INVALID; (int)paramType < 4; paramType = paramType + TYPE_FLOAT) {
    for (iStack_4c8 = 0; iStack_4c8 < (int)paramTypeNames[2]; iStack_4c8 = iStack_4c8 + 1) {
      dataType = this->m_paramTypes[iStack_4c8];
      poVar8 = std::operator<<(local_b28,"\t");
      poVar8 = std::operator<<(poVar8,local_138 + (long)iStack_4c8 * 0x20);
      poVar8 = std::operator<<(poVar8,paramTypeNames[(long)iStack_4c8 + -1]);
      poVar8 = std::operator<<(poVar8," in");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,paramType);
      poVar8 = std::operator<<(poVar8,(char)iStack_4c8 + 'a');
      std::operator<<(poVar8," = ");
      if (dataType != TYPE_FLOAT_VEC4) {
        poVar8 = std::operator<<(local_b28,paramTypeNames[(long)iStack_4c8 + -1]);
        std::operator<<(poVar8,"(");
      }
      bVar2 = glu::isDataTypeMatrix(dataType);
      if (bVar2) {
        swizzle.field_2._12_4_ = glu::getDataTypeMatrixNumRows(dataType);
        swizzle.field_2._8_4_ = glu::getDataTypeMatrixNumColumns(dataType);
        calcNdx_1._3_1_ = 0;
        calcNdx_1._2_1_ = 0;
        calcNdx_1._0_1_ = 0;
        if ((int)swizzle.field_2._12_4_ < 4) {
          std::__cxx11::string::string((string *)&i_3);
          calcNdx_1._3_1_ = 1;
          std::operator+(&local_518,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_3,
                         ".");
          calcNdx_1._2_1_ = 1;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4f8,&local_518,
                         generateSingleProgramData::swizzles[swizzle.field_2._12_4_ + -1]);
        }
        else {
          std::allocator<char>::allocator();
          calcNdx_1._0_1_ = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_4f8,"",(allocator<char> *)((long)&calcNdx_1 + 1));
        }
        if (((byte)calcNdx_1 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)((long)&calcNdx_1 + 1));
        }
        if ((calcNdx_1._2_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_518);
        }
        if ((calcNdx_1._3_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&i_3);
        }
        for (inputNdx = 0; inputNdx < (int)swizzle.field_2._8_4_; inputNdx = inputNdx + 1) {
          pcVar7 = "";
          if (0 < inputNdx) {
            pcVar7 = ", ";
          }
          poVar8 = std::operator<<(local_b28,pcVar7);
          poVar8 = std::operator<<(poVar8,local_bc0);
          poVar8 = std::operator<<(poVar8,"in");
          poVar8 = (ostream *)std::ostream::operator<<(poVar8,paramType + iStack_4c8);
          std::operator<<(poVar8,(string *)local_4f8);
        }
        std::__cxx11::string::~string((string *)local_4f8);
      }
      else {
        poVar8 = std::operator<<(local_b28,local_bc0);
        poVar8 = std::operator<<(poVar8,"in");
        std::ostream::operator<<(poVar8,paramType + iStack_4c8);
        if (iStack_4c8 == this->m_modifyParamNdx) {
          std::operator<<(local_b28," + 2.0");
        }
      }
      if (dataType != TYPE_FLOAT_VEC4) {
        std::operator<<(local_b28,")");
      }
      std::operator<<(local_b28,";\n");
    }
    poVar8 = std::operator<<(local_b28,"\t");
    poVar8 = std::operator<<(poVar8,(string *)local_50);
    poVar8 = std::operator<<(poVar8,(char *)returnPrecisionMaybe.field_2._8_8_);
    poVar8 = std::operator<<(poVar8," res");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,paramType);
    poVar8 = std::operator<<(poVar8," = ");
    poVar8 = std::operator<<(poVar8,(char *)returnPrecisionMaybe.field_2._8_8_);
    std::operator<<(poVar8,"(0);\n");
  }
  std::operator<<(local_b28,"\tfor (int i = 0; i < u_numLoopIterations; i++)\n");
  std::operator<<(local_b28,"\t{\n");
  for (inputName.field_2._12_4_ = 0; (int)inputName.field_2._12_4_ < 4;
      inputName.field_2._12_4_ = inputName.field_2._12_4_ + 1) {
    if (0 < (int)inputName.field_2._12_4_) {
      std::operator<<(local_b28,"\n");
    }
    std::operator<<(local_b28,"\t\t{\n");
    for (inputName.field_2._8_4_ = 0; (int)inputName.field_2._8_4_ < (int)paramTypeNames[2];
        inputName.field_2._8_4_ = inputName.field_2._8_4_ + 1) {
      de::toString<int>((string *)((long)&incName.field_2 + 8),
                        (int *)(inputName.field_2._M_local_buf + 0xc));
      std::operator+(&local_588,"in",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&incName.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_568,
                     &local_588,(char)inputName.field_2._8_4_ + 'a');
      std::__cxx11::string::~string((string *)&local_588);
      std::__cxx11::string::~string((string *)(incName.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)(incExpr.field_2._M_local_buf + 8));
      std::operator+(&local_5e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (incExpr.field_2._M_local_buf + 8),"u_inc");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8,
                     &local_5e8,(char)inputName.field_2._8_4_ + 'A');
      std::__cxx11::string::~string((string *)&local_5e8);
      std::__cxx11::string::~string((string *)(incExpr.field_2._M_local_buf + 8));
      incrementExpr((string *)local_628,(string *)local_5c8,
                    this->m_paramTypes[(int)inputName.field_2._8_4_],
                    (bool)(this->m_useNearlyConstantInputs & 1));
      poVar8 = std::operator<<(local_b28,"\t\t\t");
      poVar8 = std::operator<<(poVar8,(string *)local_568);
      poVar8 = std::operator<<(poVar8," = ");
      sumExpr((string *)local_648,(string *)local_568,(string *)local_628,
              this->m_paramTypes[(int)inputName.field_2._8_4_]);
      poVar8 = std::operator<<(poVar8,(string *)local_648);
      std::operator<<(poVar8,";\n");
      std::__cxx11::string::~string((string *)local_648);
      std::__cxx11::string::~string((string *)local_628);
      std::__cxx11::string::~string((string *)local_5c8);
      std::__cxx11::string::~string((string *)local_568);
    }
    poVar8 = std::operator<<(local_b28,"\t\t\t");
    poVar8 = std::operator<<(poVar8,(string *)local_50);
    poVar8 = std::operator<<(poVar8,(char *)returnPrecisionMaybe.field_2._8_8_);
    poVar8 = std::operator<<(poVar8," eval");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,inputName.field_2._12_4_);
    std::operator<<(poVar8," = ");
    if (programID == PROGRAM_WITH_FUNCTION_CALLS) {
      poVar8 = std::operator<<(local_b28,(string *)&this->m_func);
      std::operator<<(poVar8,"(");
      for (resName.field_2._12_4_ = 0; (int)resName.field_2._12_4_ < (int)paramTypeNames[2];
          resName.field_2._12_4_ = resName.field_2._12_4_ + 1) {
        if (0 < (int)resName.field_2._12_4_) {
          std::operator<<(local_b28,", ");
        }
        poVar8 = std::operator<<(local_b28,"in");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,inputName.field_2._12_4_);
        std::operator<<(poVar8,(char)resName.field_2._12_4_ + 'a');
      }
      std::operator<<(local_b28,")");
    }
    else {
      poVar8 = std::operator<<(local_b28,(char *)returnPrecisionMaybe.field_2._8_8_);
      std::operator<<(poVar8,"(1)");
    }
    std::operator<<(local_b28,";\n");
    de::toString<int>((string *)((long)&evalName.field_2 + 8),
                      (int *)(inputName.field_2._M_local_buf + 0xc));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_670,
                   "res",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&evalName.field_2 + 8));
    std::__cxx11::string::~string((string *)(evalName.field_2._M_local_buf + 8));
    de::toString<int>((string *)((long)&incExpr_1.field_2 + 8),
                      (int *)(inputName.field_2._M_local_buf + 0xc));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b0,
                   "eval",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&incExpr_1.field_2 + 8));
    std::__cxx11::string::~string((string *)(incExpr_1.field_2._M_local_buf + 8));
    incrementExpr((string *)local_6f0,(string *)local_6b0,this->m_returnType,
                  (bool)(this->m_useNearlyConstantInputs & 1));
    poVar8 = std::operator<<(local_b28,"\t\t\tres");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,inputName.field_2._12_4_);
    poVar8 = std::operator<<(poVar8," = ");
    sumExpr((string *)local_710,(string *)local_670,(string *)local_6f0,this->m_returnType);
    poVar8 = std::operator<<(poVar8,(string *)local_710);
    std::operator<<(poVar8,";\n");
    std::__cxx11::string::~string((string *)local_710);
    std::__cxx11::string::~string((string *)local_6f0);
    std::__cxx11::string::~string((string *)local_6b0);
    std::__cxx11::string::~string((string *)local_670);
    std::operator<<(local_b28,"\t\t}\n");
  }
  std::operator<<(local_b28,"\t}\n");
  std::operator<<(local_b28,"\n");
  for (expr.field_2._12_4_ = 0; (int)expr.field_2._12_4_ < (int)paramTypeNames[2];
      expr.field_2._12_4_ = expr.field_2._12_4_ + 1) {
    poVar8 = std::operator<<(local_b28,"\t");
    poVar8 = std::operator<<(poVar8,local_138 + (long)(int)expr.field_2._12_4_ * 0x20);
    poVar8 = std::operator<<(poVar8,paramTypeNames[(long)(int)expr.field_2._12_4_ + -1]);
    poVar8 = std::operator<<(poVar8," sumIn");
    poVar8 = std::operator<<(poVar8,(char)expr.field_2._12_4_ + 'A');
    std::operator<<(poVar8," = ");
    std::__cxx11::string::string((string *)local_778);
    std::operator+(&local_758,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778,
                   "in0");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_738,
                   &local_758,(char)expr.field_2._12_4_ + 'a');
    std::__cxx11::string::~string((string *)&local_758);
    std::__cxx11::string::~string((string *)local_778);
    for (local_77c = 1; local_77c < 4; local_77c = local_77c + 1) {
      std::__cxx11::string::string((string *)&local_820);
      std::operator+(&local_800,&local_820,"in");
      de::toString<int>((string *)((long)&expr_1.field_2 + 8),&local_77c);
      std::operator+(&local_7e0,&local_800,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&expr_1.field_2 + 8));
      std::operator+(&local_7c0,&local_7e0,(char)expr.field_2._12_4_ + 'a');
      sumExpr(&local_7a0,(string *)local_738,&local_7c0,this->m_paramTypes[(int)expr.field_2._12_4_]
             );
      std::__cxx11::string::operator=((string *)local_738,(string *)&local_7a0);
      std::__cxx11::string::~string((string *)&local_7a0);
      std::__cxx11::string::~string((string *)&local_7c0);
      std::__cxx11::string::~string((string *)&local_7e0);
      std::__cxx11::string::~string((string *)(expr_1.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_800);
      std::__cxx11::string::~string((string *)&local_820);
    }
    std::operator<<(local_b28,(string *)local_738);
    std::__cxx11::string::~string((string *)local_738);
    std::operator<<(local_b28,";\n");
  }
  poVar8 = std::operator<<(local_b28,"\t");
  poVar8 = std::operator<<(poVar8,(string *)local_50);
  poVar8 = std::operator<<(poVar8,(char *)returnPrecisionMaybe.field_2._8_8_);
  std::operator<<(poVar8," sumRes = ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i_5,"res0",&local_861);
  std::allocator<char>::~allocator(&local_861);
  for (local_868 = 1; local_868 < 4; local_868 = local_868 + 1) {
    de::toString<int>((string *)&inputNdx_2,&local_868);
    std::operator+(&local_8a8,"res",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inputNdx_2)
    ;
    sumExpr(&local_888,(string *)&i_5,&local_8a8,this->m_returnType);
    std::__cxx11::string::operator=((string *)&i_5,(string *)&local_888);
    std::__cxx11::string::~string((string *)&local_888);
    std::__cxx11::string::~string((string *)&local_8a8);
    std::__cxx11::string::~string((string *)&inputNdx_2);
  }
  std::operator<<(local_b28,(string *)&i_5);
  std::__cxx11::string::~string((string *)&i_5);
  std::operator<<(local_b28,";\n");
  bVar2 = glu::isDataTypeMatrix(this->m_returnType);
  if (bVar2) {
    numFinalResComponents = this->m_returnType;
    poVar8 = std::operator<<(local_b28,"\t");
    poVar8 = std::operator<<(poVar8,pcVar6);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,(char *)returnPrecisionMaybe.field_2._8_8_);
    std::operator<<(poVar8," finalRes = ");
    for (inputNdx_3 = 0; inputNdx_3 < (int)paramTypeNames[2]; inputNdx_3 = inputNdx_3 + 1) {
      poVar8 = std::operator<<(local_b28,"sumIn");
      poVar8 = std::operator<<(poVar8,(char)inputNdx_3 + 'A');
      std::operator<<(poVar8," + ");
    }
    std::operator<<(local_b28,"sumRes;\n");
  }
  else {
    finalResType.field_2._12_4_ = glu::getDataTypeScalarSize(this->m_returnType);
    for (finalResType.field_2._8_4_ = 0; x = finalResType.field_2._12_4_,
        (int)finalResType.field_2._8_4_ < (int)paramTypeNames[2];
        finalResType.field_2._8_4_ = finalResType.field_2._8_4_ + 1) {
      iVar4 = glu::getDataTypeScalarSize(this->m_paramTypes[(int)finalResType.field_2._8_4_]);
      finalResType.field_2._12_4_ = de::max<int>(x,iVar4);
    }
    numFinalResComponents = getDataTypeFloatOrVec(finalResType.field_2._12_4_);
    pcVar7 = glu::getDataTypeName(numFinalResComponents);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&inputNdx_4,pcVar7,(allocator<char> *)((long)&size + 3));
    std::allocator<char>::~allocator((allocator<char> *)((long)&size + 3));
    poVar8 = std::operator<<(local_b28,"\t");
    poVar8 = std::operator<<(poVar8,pcVar6);
    poVar8 = std::operator<<(poVar8," ");
    poVar8 = std::operator<<(poVar8,(string *)&inputNdx_4);
    std::operator<<(poVar8," finalRes = ");
    for (i_6 = 0; i_6 < (int)paramTypeNames[2]; i_6 = i_6 + 1) {
      poVar8 = std::operator<<(local_b28,(string *)&inputNdx_4);
      poVar8 = std::operator<<(poVar8,"(sumIn");
      poVar8 = std::operator<<(poVar8,(char)i_6 + 'A');
      std::operator<<(poVar8,") + ");
    }
    poVar8 = std::operator<<(local_b28,(string *)&inputNdx_4);
    std::operator<<(poVar8,"(sumRes);\n");
    std::__cxx11::string::~string((string *)&inputNdx_4);
  }
  std::operator<<(local_b28,"\tmediump vec4 color = ");
  if (numFinalResComponents == 4) {
    std::operator<<(local_b28,"finalRes");
  }
  else {
    if (bVar1) {
      local_e08 = glu::getDataTypeMatrixNumRows(numFinalResComponents);
    }
    else {
      local_e08 = glu::getDataTypeScalarSize(numFinalResComponents);
    }
    std::operator<<(local_b28,"vec4(");
    if (bVar1) {
      for (i_8 = 0; iVar4 = glu::getDataTypeMatrixNumColumns(numFinalResComponents), i_8 < iVar4;
          i_8 = i_8 + 1) {
        if (0 < i_8) {
          std::operator<<(local_b28," + ");
        }
        poVar8 = std::operator<<(local_b28,"finalRes[");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,i_8);
        std::operator<<(poVar8,"]");
      }
    }
    else {
      std::operator<<(local_b28,"finalRes");
    }
    for (attributes.
         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_e08;
        attributes.
        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 4;
        attributes.
        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             attributes.
             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      poVar8 = std::operator<<(local_b28,", ");
      if (attributes.
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 3) {
        local_e38 = "1.0";
      }
      else {
        local_e38 = "0.0";
      }
      std::operator<<(poVar8,local_e38);
    }
    std::operator<<(local_b28,")");
  }
  std::operator<<(local_b28,";\n");
  poVar8 = std::operator<<(local_b28,"\t");
  if (bVar11) {
    local_e48 = "v_color";
  }
  else {
    local_e48 = "o_color";
  }
  poVar8 = std::operator<<(poVar8,local_e48);
  std::operator<<(poVar8," = color;\n");
  if (bVar11) {
    std::operator<<((ostream *)&frag.field_0x170,"\tgl_Position = a_position + u_zero*color;\n");
    std::operator<<((ostream *)&op,"\to_color = v_color;\n");
  }
  else {
    for (attributes.
         super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (int)attributes.
             super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage < iVar3;
        attributes.
        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)attributes.
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
      poVar8 = std::operator<<((ostream *)&frag.field_0x170,"\tv_in");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,(int)attributes.
                                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar8 = std::operator<<(poVar8," = a_in");
      poVar8 = (ostream *)
               std::ostream::operator<<
                         (poVar8,(int)attributes.
                                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator<<(poVar8,";\n");
    }
  }
  std::operator<<((ostream *)&frag.field_0x170,"}\n");
  std::operator<<((ostream *)&op,"}\n");
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  ::vector((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
            *)local_928);
  for (local_92c = 0; local_92c < iVar3; local_92c = local_92c + 1) {
    de::toString<int>(&local_9d0,&local_92c);
    std::operator+(&local_9b0,"a_in",&local_9d0);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    iVar4 = (int)this;
    uVar5 = local_92c + 1U;
    if ((int)(local_92c + 1U) < 0) {
      uVar5 = local_92c + 4;
    }
    uVar9 = local_92c + 2U;
    if ((int)(local_92c + 2U) < 0) {
      uVar9 = local_92c + 5;
    }
    tcu::Vector<float,_4>::swizzle
              (&local_9e0,iVar4 + 0x1e0,local_92c % 4,(local_92c + 1) - (uVar5 & 0xfffffffc),
               (local_92c + 2) - (uVar9 & 0xfffffffc));
    uVar5 = local_92c + 1U;
    if ((int)(local_92c + 1U) < 0) {
      uVar5 = local_92c + 4;
    }
    uVar9 = local_92c + 2U;
    if ((int)(local_92c + 2U) < 0) {
      uVar9 = local_92c + 5;
    }
    uVar10 = local_92c + 3U;
    if ((int)(local_92c + 3U) < 0) {
      uVar10 = local_92c + 6;
    }
    tcu::Vector<float,_4>::swizzle
              (&local_9f0,iVar4 + 0x1e0,(local_92c + 1) - (uVar5 & 0xfffffffc),
               (local_92c + 2) - (uVar9 & 0xfffffffc),(local_92c + 3) - (uVar10 & 0xfffffffc));
    uVar5 = local_92c + 2U;
    if ((int)(local_92c + 2U) < 0) {
      uVar5 = local_92c + 5;
    }
    uVar9 = local_92c + 3U;
    if ((int)(local_92c + 3U) < 0) {
      uVar9 = local_92c + 6;
    }
    tcu::Vector<float,_4>::swizzle
              (&local_a00,iVar4 + 0x1e0,(local_92c + 2) - (uVar5 & 0xfffffffc),
               (local_92c + 3) - (uVar9 & 0xfffffffc),local_92c % 4);
    uVar5 = local_92c + 3U;
    if ((int)(local_92c + 3U) < 0) {
      uVar5 = local_92c + 6;
    }
    uVar9 = local_92c + 1U;
    if ((int)(local_92c + 1U) < 0) {
      uVar9 = local_92c + 4;
    }
    tcu::Vector<float,_4>::swizzle
              ((Vector<float,_4> *)((long)&description.field_2 + 8),iVar4 + 0x1e0,
               (local_92c + 3) - (uVar5 & 0xfffffffc),local_92c % 4,
               (local_92c + 1) - (uVar9 & 0xfffffffc));
    OperatorPerformanceCase::AttribSpec::AttribSpec
              (&local_990,pcVar6,&local_9e0,&local_9f0,&local_a00,
               (Vec4 *)((long)&description.field_2 + 8));
    std::
    vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
    ::push_back((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                 *)local_928,&local_990);
    OperatorPerformanceCase::AttribSpec::~AttribSpec(&local_990);
    std::__cxx11::string::~string((string *)&local_9b0);
    std::__cxx11::string::~string((string *)&local_9d0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a30,"This is the program ",&local_a31);
  std::allocator<char>::~allocator(&local_a31);
  if (programID == PROGRAM_WITHOUT_FUNCTION_CALLS) {
    local_ea0 = "without";
  }
  else {
    local_ea0 = (char *)0x0;
    if (programID == PROGRAM_WITH_FUNCTION_CALLS) {
      local_ea0 = "with";
    }
  }
  std::__cxx11::string::operator+=((string *)local_a30,local_ea0);
  std::operator+(&local_a78," \'",&this->m_func);
  std::operator+(&local_a58,&local_a78,
                 "\' function calls.\nNote: workload size for this program means the number of loop iterations."
                );
  std::__cxx11::string::operator+=((string *)local_a30,(string *)&local_a58);
  std::__cxx11::string::~string((string *)&local_a58);
  std::__cxx11::string::~string((string *)&local_a78);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  OperatorPerformanceCase::ProgramContext::ProgramContext
            (__return_storage_ptr__,&local_a98,&local_ab8,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
              *)local_928,(string *)local_a30);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::__cxx11::string::~string((string *)&local_a98);
  std::__cxx11::string::~string((string *)local_a30);
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  ::~vector((vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
             *)local_928);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&op);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag.field_0x170);
  local_ea8 = (string *)(paramPrecisionsMaybe[2].field_2._M_local_buf + 8);
  do {
    local_ea8 = local_ea8 + -0x20;
    std::__cxx11::string::~string(local_ea8);
  } while (local_ea8 != local_138);
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

FunctionCase::ProgramContext FunctionCase::generateSingleProgramData (ProgramID programID) const
{
	const bool			isVertexCase			= m_caseType == CASETYPE_VERTEX;
	const char* const	precision				= glu::getPrecisionName(m_precision);
	const char* const	returnTypeName			= getDataTypeName(m_returnType);
	const string		returnPrecisionMaybe	= glu::isDataTypeBoolOrBVec(m_returnType) ? "" : string() + precision + " ";
	const char*			inputPrecision			= DE_NULL;
	const bool			isMatrixReturn			= isDataTypeMatrix(m_returnType);
	int					numParams				= 0;
	const char*			paramTypeNames[MAX_PARAMS];
	string				paramPrecisionsMaybe[MAX_PARAMS];

	for (int i = 0; i < MAX_PARAMS; i++)
	{
		paramTypeNames[i]			= getDataTypeName(m_paramTypes[i]);
		paramPrecisionsMaybe[i]		= glu::isDataTypeBoolOrBVec(m_paramTypes[i]) ? "" : string() + precision + " ";

		if (inputPrecision == DE_NULL && isDataTypeIntOrIVec(m_paramTypes[i]) && m_precision == glu::PRECISION_LOWP)
			inputPrecision = "mediump";

		if (m_paramTypes[i] != TYPE_INVALID)
			numParams = i+1;
	}

	DE_ASSERT(numParams > 0);

	if (inputPrecision == DE_NULL)
		inputPrecision = precision;

	int						numAttributes	= FUNCTION_CASE_NUM_INDEPENDENT_CALCULATIONS + numParams - 1;
	std::ostringstream		vtx;
	std::ostringstream		frag;
	std::ostringstream&		op				= isVertexCase ? vtx : frag;

	vtx << "#version 300 es\n";
	frag << "#version 300 es\n"
		 << "layout (location = 0) out mediump vec4 o_color;\n";

	// Attributes.
	vtx << "in highp vec4 a_position;\n";
	for (int i = 0; i < numAttributes; i++)
		vtx << "in " << inputPrecision << " vec4 a_in" << i << ";\n";

	if (isVertexCase)
	{
		vtx << "out mediump vec4 v_color;\n";
		frag << "in mediump vec4 v_color;\n";
	}
	else
	{
		for (int i = 0; i < numAttributes; i++)
		{
			vtx << "out " << inputPrecision << " vec4 v_in" << i << ";\n";
			frag << "in " << inputPrecision << " vec4 v_in" << i << ";\n";
		}
	}

	op << "uniform mediump int u_numLoopIterations;\n";
	if (isVertexCase)
		op << "uniform mediump float u_zero;\n";

	for (int paramNdx = 0; paramNdx < numParams; paramNdx++)
		op << "uniform " << paramPrecisionsMaybe[paramNdx] << paramTypeNames[paramNdx] << " u_inc" << (char)('A'+paramNdx) << ";\n";

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";

	if (!isVertexCase)
		vtx << "\tgl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	// Function call input and return value accumulation variables.
	{
		const char* const inPrefix = isVertexCase ? "a_" : "v_";

		for (int calcNdx = 0; calcNdx < FUNCTION_CASE_NUM_INDEPENDENT_CALCULATIONS; calcNdx++)
		{
			for (int paramNdx = 0; paramNdx < numParams; paramNdx++)
			{
				const glu::DataType		paramType	= m_paramTypes[paramNdx];
				const bool				mustCast	= paramType != glu::TYPE_FLOAT_VEC4;

				op << "\t" << paramPrecisionsMaybe[paramNdx] << paramTypeNames[paramNdx] << " in" << calcNdx << (char)('a'+paramNdx) << " = ";

				if (mustCast)
					op << paramTypeNames[paramNdx] << "(";

				if (glu::isDataTypeMatrix(paramType))
				{
					static const char* const	swizzles[3]		= { "x", "xy", "xyz" };
					const int					numRows			= glu::getDataTypeMatrixNumRows(paramType);
					const int					numCols			= glu::getDataTypeMatrixNumColumns(paramType);
					const string				swizzle			= numRows < 4 ? string() + "." + swizzles[numRows-1] : "";

					for (int i = 0; i < numCols; i++)
						op << (i > 0 ? ", " : "") << inPrefix << "in" << calcNdx+paramNdx << swizzle;
				}
				else
				{
					op << inPrefix << "in" << calcNdx+paramNdx;

					if (paramNdx == m_modifyParamNdx)
					{
						DE_ASSERT(glu::isDataTypeFloatOrVec(paramType));
						op << " + 2.0";
					}
				}

				if (mustCast)
					op << ")";

				op << ";\n";
			}

			op << "\t" << returnPrecisionMaybe << returnTypeName << " res" << calcNdx << " = " << returnTypeName << "(0);\n";
		}
	}

	// Loop with expressions in it.
	op << "\tfor (int i = 0; i < u_numLoopIterations; i++)\n";
	op << "\t{\n";
	for (int calcNdx = 0; calcNdx < FUNCTION_CASE_NUM_INDEPENDENT_CALCULATIONS; calcNdx++)
	{
		if (calcNdx > 0)
			op << "\n";

		op << "\t\t{\n";

		for (int inputNdx = 0; inputNdx < numParams; inputNdx++)
		{
			const string inputName	= "in" + de::toString(calcNdx) + (char)('a'+inputNdx);
			const string incName	= string() + "u_inc" + (char)('A'+inputNdx);
			const string incExpr	= incrementExpr(incName, m_paramTypes[inputNdx], m_useNearlyConstantInputs);

			op << "\t\t\t" << inputName << " = " << sumExpr(inputName, incExpr, m_paramTypes[inputNdx]) << ";\n";
		}

		op << "\t\t\t" << returnPrecisionMaybe << returnTypeName << " eval" << calcNdx << " = ";

		if (programID == PROGRAM_WITH_FUNCTION_CALLS)
		{
			op << m_func << "(";

			for (int paramNdx = 0; paramNdx < numParams; paramNdx++)
			{
				if (paramNdx > 0)
					op << ", ";

				op << "in" << calcNdx << (char)('a'+paramNdx);
			}

			op << ")";
		}
		else
		{
			DE_ASSERT(programID == PROGRAM_WITHOUT_FUNCTION_CALLS);
			op << returnTypeName << "(1)";
		}

		op << ";\n";

		{
			const string resName	= "res" + de::toString(calcNdx);
			const string evalName	= "eval" + de::toString(calcNdx);
			const string incExpr	= incrementExpr(evalName, m_returnType, m_useNearlyConstantInputs);

			op << "\t\t\tres" << calcNdx << " = " << sumExpr(resName, incExpr, m_returnType) << ";\n";
		}

		op << "\t\t}\n";
	}
	op << "\t}\n";
	op << "\n";

	// Result variables.
	for (int inputNdx = 0; inputNdx < numParams; inputNdx++)
	{
		op << "\t" << paramPrecisionsMaybe[inputNdx] << paramTypeNames[inputNdx] << " sumIn" << (char)('A'+inputNdx) << " = ";
		{
			string expr = string() + "in0" + (char)('a'+inputNdx);
			for (int i = 1; i < FUNCTION_CASE_NUM_INDEPENDENT_CALCULATIONS; i++)
				expr = sumExpr(expr, string() + "in" + de::toString(i) + (char)('a'+inputNdx), m_paramTypes[inputNdx]);
			op << expr;
		}
		op << ";\n";
	}

	op << "\t" << returnPrecisionMaybe << returnTypeName << " sumRes = ";
	{
		string expr = "res0";
		for (int i = 1; i < FUNCTION_CASE_NUM_INDEPENDENT_CALCULATIONS; i++)
			expr = sumExpr(expr, "res" + de::toString(i), m_returnType);
		op << expr;
	}
	op << ";\n";

	{
		glu::DataType finalResultDataType = glu::TYPE_LAST;

		if (glu::isDataTypeMatrix(m_returnType))
		{
			finalResultDataType = m_returnType;

			op << "\t" << precision << " " << returnTypeName << " finalRes = ";

			for (int inputNdx = 0; inputNdx < numParams; inputNdx++)
			{
				DE_ASSERT(m_paramTypes[inputNdx] == m_returnType);
				op << "sumIn" << (char)('A'+inputNdx) << " + ";
			}
			op << "sumRes;\n";
		}
		else
		{
			int numFinalResComponents = glu::getDataTypeScalarSize(m_returnType);
			for (int inputNdx = 0; inputNdx < numParams; inputNdx++)
				numFinalResComponents = de::max(numFinalResComponents, glu::getDataTypeScalarSize(m_paramTypes[inputNdx]));

			finalResultDataType = getDataTypeFloatOrVec(numFinalResComponents);

			{
				const string finalResType = glu::getDataTypeName(finalResultDataType);
				op << "\t" << precision << " " << finalResType << " finalRes = ";
				for (int inputNdx = 0; inputNdx < numParams; inputNdx++)
					op << finalResType << "(sumIn" << (char)('A'+inputNdx) << ") + ";
				op << finalResType << "(sumRes);\n";
			}
		}

		// Convert to color.
		op << "\tmediump vec4 color = ";
		if (finalResultDataType == TYPE_FLOAT_VEC4)
			op << "finalRes";
		else
		{
			int size = isMatrixReturn ? getDataTypeMatrixNumRows(finalResultDataType) : getDataTypeScalarSize(finalResultDataType);

			op << "vec4(";

			if (isMatrixReturn)
			{
				for (int i = 0; i < getDataTypeMatrixNumColumns(finalResultDataType); i++)
				{
					if (i > 0)
						op << " + ";
					op << "finalRes[" << i << "]";
				}
			}
			else
				op << "finalRes";

			for (int i = size; i < 4; i++)
				op << ", " << (i == 3 ? "1.0" : "0.0");

			op << ")";
		}
		op << ";\n";
		op << "\t" << (isVertexCase ? "v_color" : "o_color") << " = color;\n";

		if (isVertexCase)
		{
			vtx << "	gl_Position = a_position + u_zero*color;\n";
			frag << "	o_color = v_color;\n";
		}
		else
		{
			for (int i = 0; i < numAttributes; i++)
				vtx << "	v_in" << i << " = a_in" << i << ";\n";
		}

		vtx << "}\n";
		frag << "}\n";
	}

	{
		vector<AttribSpec> attributes;
		for (int i = 0; i < numAttributes; i++)
			attributes.push_back(AttribSpec(("a_in" + de::toString(i)).c_str(),
											m_attribute.swizzle((i+0)%4, (i+1)%4, (i+2)%4, (i+3)%4),
											m_attribute.swizzle((i+1)%4, (i+2)%4, (i+3)%4, (i+0)%4),
											m_attribute.swizzle((i+2)%4, (i+3)%4, (i+0)%4, (i+1)%4),
											m_attribute.swizzle((i+3)%4, (i+0)%4, (i+1)%4, (i+2)%4)));

		{
			string description = "This is the program ";

			description += programID == PROGRAM_WITHOUT_FUNCTION_CALLS	? "without"
						 : programID == PROGRAM_WITH_FUNCTION_CALLS		? "with"
						 : DE_NULL;

			description += " '" + m_func + "' function calls.\n"
						   "Note: workload size for this program means the number of loop iterations.";

			return ProgramContext(vtx.str(), frag.str(), attributes, description);
		}
	}
}